

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

Abc_Cex_t * Llb_CoreDeriveCex(Llb_Img_t *p)

{
  ulong uVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  bool bVar7;
  Abc_Cex_t *pAVar8;
  int iVar9;
  char *string;
  Vec_Ptr_t *pVVar10;
  Abc_Cex_t *p_00;
  DdNode *pDVar11;
  DdNode *n;
  DdNode *pDVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  Abc_Cex_t *local_38;
  
  iVar9 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar9);
  if (p->vRings->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x6a,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  pVVar10 = p->vDdMans;
  uVar2 = pVVar10->nSize;
  lVar14 = (long)(int)uVar2;
  if (1 < lVar14) {
    uVar15 = 0;
    do {
      lVar14 = lVar14 + -1;
      ppvVar3 = pVVar10->pArray;
      pvVar4 = ppvVar3[uVar15];
      ppvVar3[uVar15] = ppvVar3[lVar14];
      pVVar10->pArray[lVar14] = pvVar4;
      uVar15 = uVar15 + 1;
    } while (uVar2 >> 1 != uVar15);
  }
  pVVar10 = Llb_ImgSupports(p->pAig,p->vDdMans,p->vVarsNs,p->vVarsCs,1,0);
  Llb_ImgSchedule(pVVar10,&vQuant0,&vQuant1,0);
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar14];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
          *(undefined8 *)((long)pvVar4 + 8) = 0;
        }
        free(pvVar4);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar10->nSize);
  }
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  if (pVVar10 != (Vec_Ptr_t *)0x0) {
    free(pVVar10);
  }
  Llb_ImgQuantifyReset(p->vDdMans);
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->vRings->nSize);
  pVVar10 = p->vRings;
  iVar9 = pVVar10->nSize;
  p_00->iFrame = iVar9 + -1;
  p_00->iPo = -1;
  if ((long)iVar9 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pDVar11 = Cudd_bddIntersect(p->ddR,(DdNode *)pVVar10->pArray[(long)iVar9 + -1],p->ddR->bFunc);
  Cudd_Ref(pDVar11);
  iVar9 = Cudd_bddPickOneCube(p->ddR,pDVar11,string);
  Cudd_RecursiveDeref(p->ddR,pDVar11);
  if (iVar9 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x80,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  pAVar5 = p->pAig;
  pVVar10 = p->vRings;
  iVar9 = (pVVar10->nSize + -1) * pAVar5->nTruePis + pAVar5->nRegs;
  if (0 < pAVar5->nTruePis) {
    pVVar6 = pAVar5->vCis;
    lVar14 = 0;
    do {
      if (pVVar6->nSize <= (int)lVar14) goto LAB_0081eb3d;
      if (string[lVar14 + pAVar5->nRegs] == '\x01') {
        iVar13 = iVar9 + (int)lVar14;
        (&p_00[1].iPo)[iVar13 >> 5] = (&p_00[1].iPo)[iVar13 >> 5] | 1 << ((byte)iVar13 & 0x1f);
      }
      lVar14 = lVar14 + 1;
    } while ((int)lVar14 < pAVar5->nTruePis);
  }
  if (pVVar10->nSize < 2) {
    pDVar11 = (DdNode *)0x0;
  }
  else {
    pDVar11 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
    Cudd_Ref(pDVar11);
  }
  uVar15 = (ulong)p->vRings->nSize;
  pAVar8 = p_00;
  if (0 < (long)uVar15) {
    do {
      local_38 = pAVar8;
      uVar2 = p->vRings->nSize;
      if ((long)(int)uVar2 < (long)uVar15) goto LAB_0081eb3d;
      uVar1 = uVar15 - 1;
      if (uVar15 != uVar2) {
        pDVar12 = (DdNode *)p->vRings->pArray[uVar1];
        n = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,pDVar11,vQuant0,vQuant1,p->vDriRefs,
                                p->pPars->TimeTarget,1,0,0);
        if (n == (DdNode *)0x0) {
          __assert_fail("bImage != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                        ,0x95,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,pDVar11);
        pDVar11 = Extra_TransferPermute(p->dd,p->ddR,n,p->vCs2Glo->pArray);
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->dd,n);
        pDVar12 = Cudd_bddIntersect(p->ddR,pDVar11,pDVar12);
        Cudd_Ref(pDVar12);
        Cudd_RecursiveDeref(p->ddR,pDVar11);
        iVar13 = Cudd_bddPickOneCube(p->ddR,pDVar12,string);
        Cudd_RecursiveDeref(p->ddR,pDVar12);
        p_00 = local_38;
        if (iVar13 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                        ,0xa5,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
        pAVar5 = p->pAig;
        iVar13 = pAVar5->nTruePis;
        iVar9 = iVar9 - iVar13;
        if (0 < iVar13) {
          pVVar10 = pAVar5->vCis;
          lVar14 = 0;
          do {
            if (pVVar10->nSize <= (int)lVar14) goto LAB_0081eb3d;
            if (string[lVar14 + pAVar5->nRegs] == '\x01') {
              iVar13 = iVar9 + (int)lVar14;
              (&local_38[1].iPo)[iVar13 >> 5] =
                   (&local_38[1].iPo)[iVar13 >> 5] | 1 << ((byte)iVar13 & 0x1f);
            }
            iVar13 = pAVar5->nTruePis;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 < iVar13);
        }
        if (uVar1 == 0) {
          if (0 < (long)pAVar5->nRegs) {
            lVar14 = 0;
            goto LAB_0081e9f1;
          }
          break;
        }
        pDVar11 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
        Cudd_Ref(pDVar11);
      }
      bVar7 = 1 < (long)uVar15;
      uVar15 = uVar1;
      pAVar8 = local_38;
    } while (bVar7);
  }
LAB_0081ea1e:
  if (iVar9 != p->pAig->nRegs) {
    __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0xb8,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  iVar9 = Saig_ManFindFailedPoCex(p->pInit,p_00);
  if ((-1 < iVar9) && (iVar9 < p->pInit->nTruePos)) {
    p_00->iPo = iVar9;
    if (string != (char *)0x0) {
      free(string);
    }
    if (0 < vQuant0->nSize) {
      lVar14 = 0;
      do {
        pvVar4 = vQuant0->pArray[lVar14];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
            *(undefined8 *)((long)pvVar4 + 8) = 0;
          }
          free(pvVar4);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < vQuant0->nSize);
    }
    if (vQuant0->pArray != (void **)0x0) {
      free(vQuant0->pArray);
      vQuant0->pArray = (void **)0x0;
    }
    if (vQuant0 != (Vec_Ptr_t *)0x0) {
      free(vQuant0);
    }
    if (0 < vQuant1->nSize) {
      lVar14 = 0;
      do {
        pvVar4 = vQuant1->pArray[lVar14];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
            *(undefined8 *)((long)pvVar4 + 8) = 0;
          }
          free(pvVar4);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < vQuant1->nSize);
    }
    if (vQuant1->pArray != (void **)0x0) {
      free(vQuant1->pArray);
      vQuant1->pArray = (void **)0x0;
    }
    if (vQuant1 != (Vec_Ptr_t *)0x0) {
      free(vQuant1);
    }
    return p_00;
  }
  __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                ,0xbb,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  while( true ) {
    if (string[lVar14] != '\0') {
      __assert_fail("pValues[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                    ,0xb1,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
    }
    lVar14 = lVar14 + 1;
    if (pAVar5->nRegs == lVar14) break;
LAB_0081e9f1:
    if ((iVar13 < 0) || (pAVar5->vCis->nSize <= iVar13 + (int)lVar14)) {
LAB_0081eb3d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  goto LAB_0081ea1e;
}

Assistant:

Abc_Cex_t * Llb_CoreDeriveCex( Llb_Img_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

    // get supports and quantified variables
    Vec_PtrReverseOrder( p->vDdMans );
    vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 1, 0 );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, 0 );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Llb_ImgQuantifyReset( p->vDdMans );
//    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0 );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
        // compute the next states
        bImage = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bState, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 1, 0, 0 );
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage ); printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );

        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
    RetValue = Saig_ManFindFailedPoCex( p->pInit, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return pCex;
}